

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

bool __thiscall
math::wide_integer::uintwide_t<24u,unsigned_char,void,false>::wr_string<char*>
          (uintwide_t<24u,unsigned_char,void,false> *this,char *str_result,uint_fast8_t base_rep,
          bool show_base,bool show_pos,bool is_uppercase,unsigned_fast_type field_width,
          char fill_char_str)

{
  char cVar1;
  unsigned_fast_type uVar2;
  ulong uVar3;
  bool bVar4;
  uchar uVar5;
  uintwide_t<24U,_unsigned_char,_void,_false> uVar6;
  size_type_conflict sVar7;
  byte *pbVar8;
  reference pcVar9;
  size_type sVar10;
  pointer pcVar11;
  uintwide_t<24U,_unsigned_char,_void,_false> *v;
  reference pcVar12;
  pointer pcVar13;
  reference pcVar14;
  pointer pcVar15;
  char local_111;
  unsigned_long local_b8;
  unsigned_fast_type local_b0;
  unsigned_fast_type dst;
  signed_fast_type pos_2;
  string_storage_hex_type str_temp_2;
  uintwide_t<24U,_unsigned_char,_void,_false> t_2;
  uintwide_t<24U,_unsigned_char,_void,_false> local_7a;
  undefined2 local_77;
  value_type_conflict4 local_75;
  uintwide_t<24U,_unsigned_char,_void,_false> local_74;
  uintwide_t<24U,_unsigned_char,_void,_false> tmp;
  ulong uStack_70;
  signed_fast_type pos_1;
  string_storage_dec_type str_temp_1;
  bool str_has_neg_sign;
  uintwide_t<24U,_unsigned_char,_void,_false> t_1;
  byte local_41;
  ulong uStack_40;
  char c;
  signed_fast_type pos;
  string_storage_oct_type str_temp;
  limb_type_conflict1 mask;
  uintwide_t<24U,_unsigned_char,_void,_false> t;
  bool wr_string_is_ok;
  bool is_uppercase_local;
  bool show_pos_local;
  bool show_base_local;
  uint_fast8_t base_rep_local;
  char *str_result_local;
  uintwide_t<24U,_unsigned_char,_void,_false> *this_local;
  
  str_temp.super_array<char,_16UL>.elems[0xc] = '\x01';
  str_temp.super_array<char,_16UL>.elems[0xd] = is_uppercase;
  str_temp.super_array<char,_16UL>.elems[0xe] = show_pos;
  str_temp.super_array<char,_16UL>.elems[0xf] = show_base;
  if (base_rep == '\b') {
    str_temp.super_array<char,_16UL>.elems._9_2_ = *(undefined2 *)this;
    str_temp.super_array<char,_16UL>.elems[0xb] = *(value_type *)(this + 2);
    str_temp.super_array<char,_16UL>.elems[8] = '\a';
    memset((void *)((long)&pos + 7),0,0x10);
    detail::fixed_static_array<char,_16U>::fixed_static_array
              ((fixed_static_array<char,_16U> *)((long)&pos + 7));
    sVar7 = detail::fixed_static_array<char,_16U>::static_size();
    uStack_40 = (ulong)(sVar7 - 1);
    bVar4 = uintwide_t<24U,_unsigned_char,_void,_false>::is_zero
                      ((uintwide_t<24U,_unsigned_char,_void,_false> *)
                       (str_temp.super_array<char,_16UL>.elems + 9));
    if (bVar4) {
      uStack_40 = uStack_40 - 1;
      pcVar9 = detail::fixed_static_array<char,_16U>::operator[]
                         ((fixed_static_array<char,_16U> *)((long)&pos + 7),
                          (size_type_conflict)uStack_40);
      *pcVar9 = '0';
    }
    else {
      while (bVar4 = uintwide_t<24U,_unsigned_char,_void,_false>::is_zero
                               ((uintwide_t<24U,_unsigned_char,_void,_false> *)
                                (str_temp.super_array<char,_16UL>.elems + 9)),
            !bVar4 && 0 < (long)uStack_40) {
        pbVar8 = detail::array_detail::array<unsigned_char,_3UL>::cbegin
                           ((array<unsigned_char,_3UL> *)
                            (str_temp.super_array<char,_16UL>.elems + 9));
        local_41 = *pbVar8 & 7;
        if (local_41 < 9) {
          local_41 = local_41 + 0x30;
        }
        uStack_40 = uStack_40 - 1;
        pbVar8 = (byte *)detail::fixed_static_array<char,_16U>::operator[]
                                   ((fixed_static_array<char,_16U> *)((long)&pos + 7),
                                    (size_type_conflict)uStack_40);
        *pbVar8 = local_41;
        operator>>=((uintwide_t<24u,unsigned_char,void,false> *)
                    (str_temp.super_array<char,_16UL>.elems + 9),3);
      }
    }
    if (((str_temp.super_array<char,_16UL>.elems[0xf] & 1U) != 0) && (0 < (long)uStack_40)) {
      uStack_40 = uStack_40 - 1;
      pcVar9 = detail::fixed_static_array<char,_16U>::operator[]
                         ((fixed_static_array<char,_16U> *)((long)&pos + 7),
                          (size_type_conflict)uStack_40);
      *pcVar9 = '0';
    }
    if (((str_temp.super_array<char,_16UL>.elems[0xe] & 1U) != 0) && (0 < (long)uStack_40)) {
      uStack_40 = uStack_40 - 1;
      pcVar9 = detail::fixed_static_array<char,_16U>::operator[]
                         ((fixed_static_array<char,_16U> *)((long)&pos + 7),
                          (size_type_conflict)uStack_40);
      *pcVar9 = '+';
    }
    if (field_width != 0) {
      sVar10 = detail::array_detail::array<char,_16UL>::size();
      register0x00000000 = sVar10 - 1;
      field_width = detail::min_unsafe<unsigned_long>
                              (&field_width,
                               (unsigned_long *)(str_temp_1.super_array<char,_17UL>.elems + 0xd));
      while (sVar10 = detail::array_detail::array<char,_16UL>::size(), cVar1 = fill_char_str,
            (long)((sVar10 - 1) - field_width) < (long)uStack_40) {
        uStack_40 = uStack_40 - 1;
        pcVar9 = detail::fixed_static_array<char,_16U>::operator[]
                           ((fixed_static_array<char,_16U> *)((long)&pos + 7),
                            (size_type_conflict)uStack_40);
        *pcVar9 = cVar1;
      }
    }
    sVar10 = detail::array_detail::array<char,_16UL>::size();
    pcVar9 = detail::fixed_static_array<char,_16U>::operator[]
                       ((fixed_static_array<char,_16U> *)((long)&pos + 7),(int)sVar10 - 1);
    *pcVar9 = '\0';
    pcVar11 = detail::array_detail::array<char,_16UL>::data((array<char,_16UL> *)((long)&pos + 7));
    detail::strcpy_unsafe<char*,char*>(str_result,pcVar11 + uStack_40);
  }
  else if (base_rep == '\n') {
    str_temp_1.super_array<char,_17UL>.elems._10_2_ = *(undefined2 *)this;
    str_temp_1.super_array<char,_17UL>.elems[0xc] = *(value_type *)(this + 2);
    str_temp_1.super_array<char,_17UL>.elems[9] = '\0';
    memset((void *)((long)&pos_1 + 3),0,0x11);
    detail::fixed_static_array<char,_17U>::fixed_static_array
              ((fixed_static_array<char,_17U> *)((long)&pos_1 + 3));
    sVar7 = detail::fixed_static_array<char,_17U>::static_size();
    uStack_70 = (ulong)(sVar7 - 1);
    bVar4 = uintwide_t<24U,_unsigned_char,_void,_false>::is_zero
                      ((uintwide_t<24U,_unsigned_char,_void,_false> *)
                       (str_temp_1.super_array<char,_17UL>.elems + 10));
    if (bVar4) {
      uStack_70 = uStack_70 - 1;
      pcVar12 = detail::fixed_static_array<char,_17U>::operator[]
                          ((fixed_static_array<char,_17U> *)((long)&pos_1 + 3),
                           (size_type_conflict)uStack_70);
      *pcVar12 = '0';
    }
    else {
      while (bVar4 = uintwide_t<24U,_unsigned_char,_void,_false>::is_zero
                               ((uintwide_t<24U,_unsigned_char,_void,_false> *)
                                (str_temp_1.super_array<char,_17UL>.elems + 10)),
            !bVar4 && 0 < (long)uStack_70) {
        local_74.values.super_array<unsigned_char,_3UL>.elems[2] =
             str_temp_1.super_array<char,_17UL>.elems[0xc];
        local_74.values.super_array<unsigned_char,_3UL>.elems[0] =
             str_temp_1.super_array<char,_17UL>.elems[10];
        local_74.values.super_array<unsigned_char,_3UL>.elems[1] =
             str_temp_1.super_array<char,_17UL>.elems[0xb];
        uintwide_t<24U,_unsigned_char,_void,_false>::eval_divide_by_single_limb
                  ((uintwide_t<24U,_unsigned_char,_void,_false> *)
                   (str_temp_1.super_array<char,_17UL>.elems + 10),'\n',0,
                   (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0);
        local_7a.values.super_array<unsigned_char,_3UL>.elems[2] =
             str_temp_1.super_array<char,_17UL>.elems[0xc];
        local_7a.values.super_array<unsigned_char,_3UL>.elems[0] =
             str_temp_1.super_array<char,_17UL>.elems[10];
        local_7a.values.super_array<unsigned_char,_3UL>.elems[1] =
             str_temp_1.super_array<char,_17UL>.elems[0xb];
        v = uintwide_t<24U,_unsigned_char,_void,_false>::mul_by_limb(&local_7a,'\n');
        uVar6 = wide_integer::operator-(&local_74,v);
        local_77 = uVar6.values.super_array<unsigned_char,_3UL>.elems._0_2_;
        local_75 = uVar6.values.super_array<unsigned_char,_3UL>.elems[2];
        uVar5 = wide_integer::uintwide_t::operator_cast_to_unsigned_char((uintwide_t *)&local_77);
        uStack_70 = uStack_70 - 1;
        pcVar12 = detail::fixed_static_array<char,_17U>::operator[]
                            ((fixed_static_array<char,_17U> *)((long)&pos_1 + 3),
                             (size_type_conflict)uStack_70);
        *pcVar12 = uVar5 + '0';
      }
    }
    if ((0 < (long)uStack_70) && ((str_temp.super_array<char,_16UL>.elems[0xe] & 1U) != 0)) {
      uStack_70 = uStack_70 - 1;
      pcVar12 = detail::fixed_static_array<char,_17U>::operator[]
                          ((fixed_static_array<char,_17U> *)((long)&pos_1 + 3),
                           (size_type_conflict)uStack_70);
      *pcVar12 = '+';
    }
    if (field_width != 0) {
      sVar10 = detail::array_detail::array<char,_17UL>::size();
      register0x00000000 = sVar10 - 1;
      field_width = detail::min_unsafe<unsigned_long>
                              (&field_width,
                               (unsigned_long *)(str_temp_2.super_array<char,_14UL>.elems + 9));
      while (uVar3 = uStack_70, sVar10 = detail::array_detail::array<char,_17UL>::size(),
            cVar1 = fill_char_str, (long)((sVar10 - 1) - field_width) < (long)uVar3) {
        uStack_70 = uStack_70 - 1;
        pcVar12 = detail::fixed_static_array<char,_17U>::operator[]
                            ((fixed_static_array<char,_17U> *)((long)&pos_1 + 3),
                             (size_type_conflict)uStack_70);
        *pcVar12 = cVar1;
      }
    }
    sVar10 = detail::array_detail::array<char,_17UL>::size();
    pcVar12 = detail::fixed_static_array<char,_17U>::operator[]
                        ((fixed_static_array<char,_17U> *)((long)&pos_1 + 3),(int)sVar10 - 1);
    *pcVar12 = '\0';
    pcVar13 = detail::array_detail::array<char,_17UL>::data((array<char,_17UL> *)((long)&pos_1 + 3))
    ;
    detail::strcpy_unsafe<char*,char*>(str_result,pcVar13 + uStack_70);
  }
  else if (base_rep == '\x10') {
    str_temp_2.super_array<char,_14UL>.elems._6_2_ = *(undefined2 *)this;
    str_temp_2.super_array<char,_14UL>.elems[8] = *(value_type *)(this + 2);
    memset((void *)((long)&pos_2 + 7),0,0xe);
    detail::fixed_static_array<char,_14U>::fixed_static_array
              ((fixed_static_array<char,_14U> *)((long)&pos_2 + 7));
    sVar7 = detail::fixed_static_array<char,_14U>::static_size();
    dst = (unsigned_fast_type)(sVar7 - 1);
    bVar4 = uintwide_t<24U,_unsigned_char,_void,_false>::is_zero
                      ((uintwide_t<24U,_unsigned_char,_void,_false> *)
                       (str_temp_2.super_array<char,_14UL>.elems + 6));
    if (bVar4) {
      dst = dst - 1;
      pcVar14 = detail::fixed_static_array<char,_14U>::operator[]
                          ((fixed_static_array<char,_14U> *)((long)&pos_2 + 7),
                           (size_type_conflict)dst);
      *pcVar14 = '0';
    }
    else {
      pcVar14 = detail::fixed_static_array<char,_14U>::operator[]
                          ((fixed_static_array<char,_14U> *)((long)&pos_2 + 7),
                           (size_type_conflict)dst);
      local_b0 = uintwide_t<24U,_unsigned_char,_void,_false>::extract_hex_digits<false,_nullptr>
                           ((uintwide_t<24U,_unsigned_char,_void,_false> *)
                            (str_temp_2.super_array<char,_14UL>.elems + 6),pcVar14,
                            (bool)(str_temp.super_array<char,_16UL>.elems[0xd] & 1));
      dst = dst - local_b0;
    }
    if (((str_temp.super_array<char,_16UL>.elems[0xf] & 1U) != 0) && (1 < (long)dst)) {
      local_111 = 'X';
      if ((str_temp.super_array<char,_16UL>.elems[0xd] & 1U) == 0) {
        local_111 = 'x';
      }
      dst = dst - 1;
      pcVar14 = detail::fixed_static_array<char,_14U>::operator[]
                          ((fixed_static_array<char,_14U> *)((long)&pos_2 + 7),
                           (size_type_conflict)dst);
      *pcVar14 = local_111;
      dst = dst - 1;
      pcVar14 = detail::fixed_static_array<char,_14U>::operator[]
                          ((fixed_static_array<char,_14U> *)((long)&pos_2 + 7),
                           (size_type_conflict)dst);
      *pcVar14 = '0';
    }
    if (((str_temp.super_array<char,_16UL>.elems[0xe] & 1U) != 0) && (0 < (long)dst)) {
      dst = dst - 1;
      pcVar14 = detail::fixed_static_array<char,_14U>::operator[]
                          ((fixed_static_array<char,_14U> *)((long)&pos_2 + 7),
                           (size_type_conflict)dst);
      *pcVar14 = '+';
    }
    if (field_width != 0) {
      sVar10 = detail::array_detail::array<char,_14UL>::size();
      local_b8 = sVar10 - 1;
      field_width = detail::min_unsafe<unsigned_long>(&field_width,&local_b8);
      while (uVar2 = dst, sVar10 = detail::array_detail::array<char,_14UL>::size(),
            cVar1 = fill_char_str, (long)((sVar10 - 1) - field_width) < (long)uVar2) {
        dst = dst - 1;
        pcVar14 = detail::fixed_static_array<char,_14U>::operator[]
                            ((fixed_static_array<char,_14U> *)((long)&pos_2 + 7),
                             (size_type_conflict)dst);
        *pcVar14 = cVar1;
      }
    }
    sVar10 = detail::array_detail::array<char,_14UL>::size();
    pcVar14 = detail::fixed_static_array<char,_14U>::operator[]
                        ((fixed_static_array<char,_14U> *)((long)&pos_2 + 7),(int)sVar10 - 1);
    *pcVar14 = '\0';
    pcVar15 = detail::array_detail::array<char,_14UL>::data((array<char,_14UL> *)((long)&pos_2 + 7))
    ;
    detail::strcpy_unsafe<char*,char*>(str_result,pcVar15 + dst);
  }
  else {
    str_temp.super_array<char,_16UL>.elems[0xc] = '\0';
  }
  return (bool)(str_temp.super_array<char,_16UL>.elems[0xc] & 1);
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }